

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Block * __thiscall soul::StructuralParser::parseStatementAsNewBlock(StructuralParser *this)

{
  char *__s1;
  SourceCodeText *o;
  DestructorFn *pDVar1;
  Scope *pSVar2;
  int iVar3;
  PoolItem *pPVar4;
  Block *pBVar5;
  pool_ptr<soul::AST::Function> local_38;
  pool_ref<soul::AST::Statement> local_30;
  
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 == "{") {
LAB_002074b0:
    local_38.object = (Function *)0x0;
    pBVar5 = parseBracedBlock(this,&local_38);
  }
  else {
    if (__s1 != (char *)0x0) {
      iVar3 = strcmp(__s1,"{");
      if (iVar3 == 0) goto LAB_002074b0;
    }
    o = (this->super_SOULTokeniser).location.sourceCode.object;
    if (o != (SourceCodeText *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    pDVar1 = (DestructorFn *)(this->super_SOULTokeniser).location.location.data;
    pSVar2 = this->currentScope;
    pPVar4 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x50);
    pPVar4->item = &PTR__ASTObject_00301658;
    *(undefined4 *)&pPVar4->field_0x18 = 9;
    pPVar4[1].size = (size_t)o;
    if (o != (SourceCodeText *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    pPVar4[1].destructor = pDVar1;
    pPVar4[1].item = pSVar2;
    pPVar4->item = &PTR__Block_00302f28;
    *(undefined ***)&pPVar4[1].field_0x18 = &PTR__Block_00302f70;
    pPVar4[2].size = 0;
    pPVar4[2].destructor = (DestructorFn *)0x0;
    pPVar4[2].item = (void *)0x0;
    *(undefined8 *)&pPVar4[2].field_0x18 = 0;
    pPVar4->destructor =
         PoolAllocator::allocate<soul::AST::Block,_soul::AST::Context,_std::nullptr_t>::
         anon_class_1_0_00000001::__invoke;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
    pSVar2 = this->currentScope;
    this->currentScope = (Scope *)&pPVar4[1].field_0x18;
    local_30.object = parseStatement(this);
    std::
    vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
    ::emplace_back<soul::pool_ref<soul::AST::Statement>>
              ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
                *)&pPVar4[2].destructor,&local_30);
    pBVar5 = (Block *)&pPVar4->item;
    this->currentScope = pSVar2;
  }
  return pBVar5;
}

Assistant:

AST::Block& parseStatementAsNewBlock()
    {
        if (matches (Operator::openBrace))
            return parseBracedBlock ({});

        auto& newBlock = allocate<AST::Block> (getContext(), nullptr);
        ScopedScope scope (*this, newBlock);
        newBlock.addStatement (parseStatement());
        return newBlock;
    }